

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

void impl_GLSL_PushConstantArray(MOJOSHADER_glProgram *program,MOJOSHADER_uniform *u,GLfloat *f)

{
  GLint GVar1;
  
  GVar1 = glsl_uniform_loc(program,u->name);
  if (-1 < GVar1) {
    (*ctx->glUniform4fv)(GVar1,u->array_count,f);
    return;
  }
  return;
}

Assistant:

static void impl_GLSL_PushConstantArray(MOJOSHADER_glProgram *program,
                                        const MOJOSHADER_uniform *u,
                                        const GLfloat *f)
{
    const GLint loc = glsl_uniform_loc(program, u->name);
    if (loc >= 0)   // not optimized out?
        ctx->glUniform4fv(loc, u->array_count, f);
}